

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

bool SaveListing(CompilerContext *ctx,char *fileName)

{
  int iVar1;
  void *pvVar2;
  undefined1 local_70 [8];
  InstructionRegVmLowerGraphContext instLowerGraphCtx;
  undefined1 local_40 [8];
  TraceScope traceScope;
  char *fileName_local;
  CompilerContext *ctx_local;
  
  if (SaveListing(CompilerContext&,char_const*)::token == '\0') {
    iVar1 = __cxa_guard_acquire(&SaveListing(CompilerContext&,char_const*)::token);
    if (iVar1 != 0) {
      SaveListing::token = NULLC::TraceGetToken("compiler","SaveListing");
      __cxa_guard_release(&SaveListing(CompilerContext&,char_const*)::token);
    }
  }
  NULLC::TraceScope::TraceScope((TraceScope *)local_40,SaveListing::token);
  if (ctx->regVmLoweredModule == (RegVmLoweredModule *)0x0) {
    NULLC::SafeSprintf(ctx->errorBuf,(ulong)ctx->errorBufSize,"ERROR: no bytecode was built");
    ctx_local._7_1_ = false;
  }
  else {
    if ((ctx->outputCtx).stream != (void *)0x0) {
      __assert_fail("!ctx.outputCtx.stream",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Compiler.cpp"
                    ,0x7d9,"bool SaveListing(CompilerContext &, const char *)");
    }
    pvVar2 = (*(ctx->outputCtx).openStream)(fileName);
    (ctx->outputCtx).stream = pvVar2;
    if ((ctx->outputCtx).stream == (void *)0x0) {
      NULLC::SafeSprintf(ctx->errorBuf,(ulong)ctx->errorBufSize,"ERROR: failed to open file");
      ctx_local._7_1_ = false;
    }
    else {
      InstructionRegVmLowerGraphContext::InstructionRegVmLowerGraphContext
                ((InstructionRegVmLowerGraphContext *)local_70,&ctx->outputCtx);
      instLowerGraphCtx.lastStartOffset._0_1_ = 1;
      PrintGraph((InstructionRegVmLowerGraphContext *)local_70,ctx->regVmLoweredModule);
      (*(ctx->outputCtx).closeStream)((ctx->outputCtx).stream);
      (ctx->outputCtx).stream = (void *)0x0;
      ctx_local._7_1_ = true;
    }
  }
  instLowerGraphCtx._36_4_ = 1;
  NULLC::TraceScope::~TraceScope((TraceScope *)local_40);
  return ctx_local._7_1_;
}

Assistant:

bool SaveListing(CompilerContext &ctx, const char *fileName)
{
	TRACE_SCOPE("compiler", "SaveListing");

	if(!ctx.regVmLoweredModule)
	{
		NULLC::SafeSprintf(ctx.errorBuf, ctx.errorBufSize, "ERROR: no bytecode was built");
		return false;
	}

	assert(!ctx.outputCtx.stream);
	ctx.outputCtx.stream = ctx.outputCtx.openStream(fileName);

	if(!ctx.outputCtx.stream)
	{
		NULLC::SafeSprintf(ctx.errorBuf, ctx.errorBufSize, "ERROR: failed to open file");
		return false;
	}

	InstructionRegVmLowerGraphContext instLowerGraphCtx(ctx.outputCtx);

	instLowerGraphCtx.showSource = true;

	PrintGraph(instLowerGraphCtx, ctx.regVmLoweredModule);

	ctx.outputCtx.closeStream(ctx.outputCtx.stream);
	ctx.outputCtx.stream = NULL;

	return true;
}